

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::init(VertexCubeTextureCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  RenderTarget *this_00;
  NotSupportedError *pNVar4;
  ShaderProgram *this_01;
  RenderContext *pRVar5;
  TestLog *log;
  TestError *this_02;
  TextureCube *this_03;
  TextureCube *pTVar6;
  TextureFormat *format;
  ulong extraout_RAX;
  ulong uVar7;
  PixelBufferAccess *pPVar8;
  Vector<float,_4> VVar9;
  float local_32c;
  exception *anon_var_0;
  int i_1;
  Vector<float,_4> local_2a0;
  Vec4 local_290;
  RGBA local_280;
  Vector<float,_4> local_27c;
  Vector<float,_4> local_26c;
  Vec4 local_25c;
  uint local_24c;
  uint local_248;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  int face_1;
  Vec4 local_224;
  Vector<float,_4> local_214;
  Vec4 local_204;
  int local_1f4;
  CubeFace local_1f0;
  int levelNdx;
  int face;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  int numLevels;
  bool mipmaps;
  int i;
  int texHeight;
  int texWidth;
  GLint maxVertexTextures;
  allocator<char> local_149;
  string local_148;
  ProgramSources local_128;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *fragmentShader;
  char *vertexShader;
  VertexCubeTextureCase *this_local;
  
  fragmentShader =
       "attribute highp vec2 a_position;\nattribute highp vec3 a_texCoord;\nuniform highp samplerCube u_texture;\nuniform highp float u_lod;\nvarying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n}\n"
  ;
  local_20 = "varying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_FragColor = v_color;\n}\n";
  vertexShader = (char *)this;
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getNumSamples(this_00);
  if (iVar2 != 0) {
    local_55 = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"MSAA config not supported by this test",&local_41);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_40);
    local_55 = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  this_01 = (ShaderProgram *)operator_new(0xd0);
  texWidth._2_1_ = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,
             "attribute highp vec2 a_position;\nattribute highp vec3 a_texCoord;\nuniform highp samplerCube u_texture;\nuniform highp float u_lod;\nvarying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxVertexTextures,
             "varying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_FragColor = v_color;\n}\n",
             (allocator<char> *)((long)&texWidth + 3));
  glu::makeVtxFragSources(&local_128,&local_148,(string *)&maxVertexTextures);
  glu::ShaderProgram::ShaderProgram(this_01,pRVar5,&local_128);
  texWidth._2_1_ = 0;
  this->m_program = this_01;
  glu::ProgramSources::~ProgramSources(&local_128);
  std::__cxx11::string::~string((string *)&maxVertexTextures);
  std::allocator<char>::~allocator((allocator<char> *)((long)&texWidth + 3));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_program);
    glwGetIntegerv(0x8b4c,&texHeight);
    if (texHeight < 1) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar4,"Vertex texture image units not supported","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
                 ,0x307);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
               ,0x309);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  iVar2 = deLog2Ceil32(0x1c);
  iVar2 = 1 << ((byte)iVar2 & 0x1f);
  deLog2Ceil32(0x1c);
  for (numLevels = 0; numLevels < 2; numLevels = numLevels + 1) {
    this_03 = (TextureCube *)operator_new(0x180);
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    glu::TextureCube::TextureCube(this_03,pRVar5,0x1907,0x1401,iVar2);
    this->m_textures[numLevels] = this_03;
  }
  dVar3 = deIsPowerOfTwo32(iVar2);
  fmtInfo.lookupBias.m_data[3]._3_1_ = dVar3 != 0;
  if ((bool)fmtInfo.lookupBias.m_data[3]._3_1_) {
    iVar2 = deLog2Floor32(iVar2);
    local_32c = (float)(iVar2 + 1);
  }
  else {
    local_32c = 1.4013e-45;
  }
  fmtInfo.lookupBias.m_data[2] = local_32c;
  pTVar6 = glu::TextureCube::getRefTexture(this->m_textures[0]);
  format = tcu::TextureCube::getFormat(pTVar6);
  tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),format);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
  VVar9 = tcu::operator-((tcu *)&levelNdx,(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                         (Vector<float,_4> *)(cBias.m_data + 2));
  uVar7 = extraout_RAX;
  if (init()::gradients == '\0') {
    uVar7 = __cxa_guard_acquire(VVar9.m_data._0_8_,VVar9.m_data._8_8_,&init()::gradients);
    if ((int)uVar7 != 0) {
      tcu::Vector<float,_4>::Vector(init::gradients[0],-1.0,-1.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[0] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1],0.0,-1.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2],-1.0,0.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3],-1.0,-1.0,0.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[4],-1.0,-1.0,-1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[4] + 1,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5],0.0,0.0,0.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5] + 1,1.0,1.0,1.0,0.0);
      uVar7 = __cxa_guard_release(&init()::gradients);
    }
  }
  local_1f0 = CUBEFACE_NEGATIVE_X;
  while ((int)local_1f0 < 6) {
    for (local_1f4 = 0; local_1f4 < (int)fmtInfo.lookupBias.m_data[2]; local_1f4 = local_1f4 + 1) {
      pTVar6 = glu::TextureCube::getRefTexture(this->m_textures[0]);
      tcu::TextureCube::allocLevel(pTVar6,local_1f0,local_1f4);
      pTVar6 = glu::TextureCube::getRefTexture(this->m_textures[0]);
      pPVar8 = tcu::TextureCube::getLevelFace(pTVar6,local_1f4,local_1f0);
      tcu::operator*((tcu *)&local_214,init::gradients[(int)local_1f0],(Vector<float,_4> *)&levelNdx
                    );
      tcu::operator+((tcu *)&local_204,&local_214,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::operator*((tcu *)&levelNdx_1,init::gradients[(int)local_1f0] + 1,
                     (Vector<float,_4> *)&levelNdx);
      tcu::operator+((tcu *)&local_224,(Vector<float,_4> *)&levelNdx_1,
                     (Vector<float,_4> *)(cScale.m_data + 2));
      tcu::fillWithComponentGradients(pPVar8,&local_204,&local_224);
    }
    local_1f0 = local_1f0 + CUBEFACE_POSITIVE_X;
    uVar7 = (ulong)local_1f0;
  }
  step = 0;
  while ((int)step < 6) {
    for (rgb = 0; (int)rgb < (int)fmtInfo.lookupBias.m_data[2]; rgb = rgb + 1) {
      colorA = (deUint32)(0xffffff / (long)((int)fmtInfo.lookupBias.m_data[2] * 6));
      colorB = colorA * rgb * step;
      local_248 = colorB | 0xff000000;
      local_24c = ~colorB | 0xff000000;
      pTVar6 = glu::TextureCube::getRefTexture(this->m_textures[1]);
      tcu::TextureCube::allocLevel(pTVar6,step,rgb);
      pTVar6 = glu::TextureCube::getRefTexture(this->m_textures[1]);
      pPVar8 = tcu::TextureCube::getLevelFace(pTVar6,rgb,step);
      tcu::RGBA::RGBA(&local_280,local_248);
      tcu::RGBA::toVec((RGBA *)&local_27c);
      tcu::operator*((tcu *)&local_26c,&local_27c,(Vector<float,_4> *)&levelNdx);
      tcu::operator+((tcu *)&local_25c,&local_26c,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::RGBA::RGBA((RGBA *)((long)&anon_var_0 + 4),local_24c);
      tcu::RGBA::toVec((RGBA *)&i_1);
      tcu::operator*((tcu *)&local_2a0,(Vector<float,_4> *)&i_1,(Vector<float,_4> *)&levelNdx);
      tcu::operator+((tcu *)&local_290,&local_2a0,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::fillWithGrid(pPVar8,4,&local_25c,&local_290);
    }
    step = step + 1;
    uVar7 = (ulong)step;
  }
  anon_var_0._0_4_ = 0;
  while ((int)(uint)anon_var_0 < 2) {
    glu::TextureCube::upload(this->m_textures[(int)(uint)anon_var_0]);
    anon_var_0._0_4_ = (uint)anon_var_0 + 1;
    uVar7 = (ulong)(uint)anon_var_0;
  }
  return (int)uVar7;
}

Assistant:

void VertexCubeTextureCase::init (void)
{
	const char* const vertexShader =
		"attribute highp vec2 a_position;\n"
		"attribute highp vec3 a_texCoord;\n"
		"uniform highp samplerCube u_texture;\n"
		"uniform highp float u_lod;\n"
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShader =
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShader, fragmentShader));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.
	try
	{
		// Compute suitable power-of-two sizes (for mipmaps).
		const int texWidth		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_WIDTH / 3 / 2);
		const int texHeight		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_HEIGHT / 2 / 2);

		DE_ASSERT(texWidth == texHeight);
		DE_UNREF(texHeight);

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::TextureCube(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth);
		}

		const bool						mipmaps		= deIsPowerOfTwo32(texWidth) != DE_FALSE;
		const int						numLevels	= mipmaps ? deLog2Floor32(texWidth)+1 : 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		static const Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ Vec4(-1.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ Vec4( 0.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ Vec4(-1.0f,  0.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ Vec4(-1.0f, -1.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ Vec4(-1.0f, -1.0f, -1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ Vec4( 0.0f,  0.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_textures[0]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				const deUint32 step		= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				const deUint32 rgb		= step*levelNdx*face;
				const deUint32 colorA	= 0xff000000 | rgb;
				const deUint32 colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		VertexCubeTextureCase::deinit();
		throw;
	}
}